

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool TranslateToC(CompilerContext *ctx,char *fileName,char *mainName,
                 _func_void_char_ptr *addDependency)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  char **ppcVar5;
  uint local_304;
  undefined1 local_300 [4];
  uint i;
  SmallArray<const_char_*,_32U> dependencies;
  ExpressionTranslateContext exprTranslateCtx;
  undefined1 local_50 [8];
  TraceScope traceScope;
  _func_void_char_ptr *addDependency_local;
  char *mainName_local;
  char *fileName_local;
  CompilerContext *ctx_local;
  
  if ((TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))::token == '\0')
     && (iVar2 = __cxa_guard_acquire(&TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))
                                      ::token), iVar2 != 0)) {
    TranslateToC::token = NULLC::TraceGetToken("compiler","TranslateToC");
    __cxa_guard_release(&TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))
                         ::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_50,TranslateToC::token);
  if ((ctx->outputCtx).stream == (void *)0x0) {
    pvVar4 = (*(ctx->outputCtx).openStream)(fileName);
    (ctx->outputCtx).stream = pvVar4;
    if ((ctx->outputCtx).stream == (void *)0x0) {
      NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,"ERROR: failed to open file");
      ctx_local._7_1_ = false;
    }
    else {
      ExpressionTranslateContext::ExpressionTranslateContext
                ((ExpressionTranslateContext *)&dependencies.allocator,&ctx->exprCtx,&ctx->outputCtx
                 ,ctx->allocator);
      SmallArray<const_char_*,_32U>::SmallArray
                ((SmallArray<const_char_*,_32U> *)local_300,ctx->allocator);
      bVar1 = TranslateModule((ExpressionTranslateContext *)&dependencies.allocator,ctx->exprModule,
                              (SmallArray<const_char_*,_32U> *)local_300);
      if (bVar1) {
        (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
        (ctx->outputCtx).stream = (void *)0x0;
        if (addDependency != (_func_void_char_ptr *)0x0) {
          for (local_304 = 0;
              uVar3 = SmallArray<const_char_*,_32U>::size
                                ((SmallArray<const_char_*,_32U> *)local_300), local_304 < uVar3;
              local_304 = local_304 + 1) {
            ppcVar5 = SmallArray<const_char_*,_32U>::operator[]
                                ((SmallArray<const_char_*,_32U> *)local_300,local_304);
            (*addDependency)(*ppcVar5);
          }
        }
        ctx_local._7_1_ = true;
      }
      else {
        (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
        (ctx->outputCtx).stream = (void *)0x0;
        ctx_local._7_1_ = false;
      }
      SmallArray<const_char_*,_32U>::~SmallArray((SmallArray<const_char_*,_32U> *)local_300);
      ExpressionTranslateContext::~ExpressionTranslateContext
                ((ExpressionTranslateContext *)&dependencies.allocator);
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_50);
    return ctx_local._7_1_;
  }
  __assert_fail("!ctx.outputCtx.stream",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                ,0x7f2,
                "bool TranslateToC(CompilerContext &, const char *, const char *, void (*)(const char *))"
               );
}

Assistant:

bool TranslateToC(CompilerContext &ctx, const char *fileName, const char *mainName, void (*addDependency)(const char *fileName))
{
	TRACE_SCOPE("compiler", "TranslateToC");

	assert(!ctx.outputCtx.stream);
	ctx.outputCtx.stream = ctx.outputCtx.openStream(fileName);

	if(!ctx.outputCtx.stream)
	{
		NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: failed to open file");
		return false;
	}

	ExpressionTranslateContext exprTranslateCtx(ctx.exprCtx, ctx.outputCtx, ctx.allocator);

	exprTranslateCtx.mainName = mainName;

	exprTranslateCtx.errorBuf = ctx.errorBuf;
	exprTranslateCtx.errorBufSize = ctx.errorBufSize;

	SmallArray<const char*, 32> dependencies(ctx.allocator);

	if(!TranslateModule(exprTranslateCtx, ctx.exprModule, dependencies))
	{
		ctx.outputCtx.closeStream(ctx.outputCtx.stream);
		ctx.outputCtx.stream = NULL;

		return false;
	}

	ctx.outputCtx.closeStream(ctx.outputCtx.stream);
	ctx.outputCtx.stream = NULL;

	if(addDependency)
	{
		for(unsigned i = 0; i < dependencies.size(); i++)
			addDependency(dependencies[i]);
	}

	return true;
}